

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void cmExtraEclipseCDT4Generator::AddEnvVar(ostream *out,char *envVar,cmLocalGenerator *lg)

{
  cmMakefile *this;
  bool bVar1;
  cmState *this_00;
  string *psVar2;
  cmake *this_01;
  long lVar3;
  size_t sVar4;
  ostream *poVar5;
  string valueToUse;
  string cacheEntryName;
  string envVarValue;
  char *local_90;
  long local_88;
  char local_80;
  undefined7 uStack_7f;
  string local_70;
  string local_50;
  
  this = lg->Makefile;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  bVar1 = cmsys::SystemTools::GetEnv(envVar,&local_50);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_ECLIPSE_ENVVAR_","");
  std::__cxx11::string::append((char *)&local_70);
  this_00 = cmLocalGenerator::GetState(lg);
  psVar2 = cmState::GetInitializedCacheValue(this_00,&local_70);
  local_88 = 0;
  local_80 = '\0';
  local_90 = &local_80;
  if (psVar2 == (string *)0x0 && !bVar1) {
    local_88 = 0;
    local_80 = '\0';
    goto LAB_0028b278;
  }
  if (bVar1 && psVar2 == (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_90);
    cmMakefile::AddCacheDefinition(this,&local_70,local_90,local_70._M_dataplus._M_p,STRING,true);
    this_01 = cmMakefile::GetCMakeInstance(this);
    psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  }
  else {
    if (!bVar1 && psVar2 != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&local_90);
      goto LAB_0028b278;
    }
    std::__cxx11::string::_M_assign((string *)&local_90);
    lVar3 = std::__cxx11::string::find((char *)&local_90,(ulong)local_50._M_dataplus._M_p,0);
    if (lVar3 != -1) goto LAB_0028b278;
    std::__cxx11::string::_M_assign((string *)&local_90);
    cmMakefile::AddCacheDefinition(this,&local_70,local_90,local_70._M_dataplus._M_p,STRING,true);
    this_01 = cmMakefile::GetCMakeInstance(this);
    psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  }
  cmake::SaveCache(this_01,psVar2);
LAB_0028b278:
  if (local_88 != 0) {
    if (envVar == (char *)0x0) {
      std::ios::clear((int)out + (int)out->_vptr_basic_ostream[-3]);
    }
    else {
      sVar4 = strlen(envVar);
      std::__ostream_insert<char,std::char_traits<char>>(out,envVar,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"=",1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(out,local_90,local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"|",1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AddEnvVar(std::ostream& out,
                                            const char* envVar,
                                            cmLocalGenerator* lg)
{
  cmMakefile* mf = lg->GetMakefile();

  // get the variables from the environment and from the cache and then
  // figure out which one to use:

  std::string envVarValue;
  const bool envVarSet = cmSystemTools::GetEnv(envVar, envVarValue);

  std::string cacheEntryName = "CMAKE_ECLIPSE_ENVVAR_";
  cacheEntryName += envVar;
  const std::string* cacheValue =
    lg->GetState()->GetInitializedCacheValue(cacheEntryName);

  // now we have both, decide which one to use
  std::string valueToUse;
  if (!envVarSet && cacheValue == nullptr) {
    // nothing known, do nothing
    valueToUse.clear();
  } else if (envVarSet && cacheValue == nullptr) {
    // The variable is in the env, but not in the cache. Use it and put it
    // in the cache
    valueToUse = envVarValue;
    mf->AddCacheDefinition(cacheEntryName, valueToUse.c_str(),
                           cacheEntryName.c_str(), cmStateEnums::STRING, true);
    mf->GetCMakeInstance()->SaveCache(lg->GetBinaryDirectory());
  } else if (!envVarSet && cacheValue != nullptr) {
    // It is already in the cache, but not in the env, so use it from the cache
    valueToUse = *cacheValue;
  } else {
    // It is both in the cache and in the env.
    // Use the version from the env. except if the value from the env is
    // completely contained in the value from the cache (for the case that we
    // now have a PATH without MSVC dirs in the env. but had the full PATH with
    // all MSVC dirs during the cmake run which stored the var in the cache:
    valueToUse = *cacheValue;
    if (valueToUse.find(envVarValue) == std::string::npos) {
      valueToUse = envVarValue;
      mf->AddCacheDefinition(cacheEntryName, valueToUse.c_str(),
                             cacheEntryName.c_str(), cmStateEnums::STRING,
                             true);
      mf->GetCMakeInstance()->SaveCache(lg->GetBinaryDirectory());
    }
  }

  if (!valueToUse.empty()) {
    out << envVar << "=" << valueToUse << "|";
  }
}